

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

handle pybind11::detail::type_caster<char,_void>::cast
                 (char *src,return_value_policy policy,handle parent)

{
  size_t sVar1;
  handle hVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (src == (char *)0x0) {
    hVar2.m_ptr = (PyObject *)&_Py_NoneStruct;
    local_48._M_dataplus._M_p = &_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 2;
    object::~object((object *)&local_48);
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar1 = strlen(src);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,src,src + sVar1);
    hVar2 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
            ::cast(&local_48,policy,parent);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(const CharT *src, return_value_policy policy, handle parent) {
        if (src == nullptr) return pybind11::none().inc_ref();
        return StringCaster::cast(StringType(src), policy, parent);
    }